

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

void __thiscall icu_63::RBBITableBuilder::flagAcceptingStates(RBBITableBuilder *this)

{
  UBool UVar1;
  int32_t iVar2;
  void *obj;
  void *pvVar3;
  RBBIStateDescriptor *sd;
  int32_t local_48;
  int32_t local_44;
  int32_t n;
  int32_t i;
  RBBINode *endMarker;
  UVector endMarkerNodes;
  RBBITableBuilder *this_local;
  
  endMarkerNodes.comparer = (UElementsAreEqual *)this;
  UVar1 = ::U_FAILURE(*this->fStatus);
  if (UVar1 == '\0') {
    UVector::UVector((UVector *)&endMarker,this->fStatus);
    UVar1 = ::U_FAILURE(*this->fStatus);
    if (UVar1 == '\0') {
      RBBINode::findNodes(*this->fTree,(UVector *)&endMarker,endMark,this->fStatus);
      UVar1 = ::U_FAILURE(*this->fStatus);
      if (UVar1 == '\0') {
        for (local_44 = 0; iVar2 = UVector::size((UVector *)&endMarker), local_44 < iVar2;
            local_44 = local_44 + 1) {
          obj = UVector::elementAt((UVector *)&endMarker,local_44);
          for (local_48 = 0; iVar2 = UVector::size(this->fDStates), local_48 < iVar2;
              local_48 = local_48 + 1) {
            pvVar3 = UVector::elementAt(this->fDStates,local_48);
            iVar2 = UVector::indexOf(*(UVector **)((long)pvVar3 + 0x20),obj,0);
            if (-1 < iVar2) {
              if ((*(int *)((long)pvVar3 + 4) == 0) &&
                 (*(undefined4 *)((long)pvVar3 + 4) = *(undefined4 *)((long)obj + 0x7c),
                 *(int *)((long)pvVar3 + 4) == 0)) {
                *(undefined4 *)((long)pvVar3 + 4) = 0xffffffff;
              }
              if ((*(int *)((long)pvVar3 + 4) == -1) && (*(int *)((long)obj + 0x7c) != 0)) {
                *(undefined4 *)((long)pvVar3 + 4) = *(undefined4 *)((long)obj + 0x7c);
              }
              if (*(char *)((long)obj + 0x80) != '\0') {
                *(undefined4 *)((long)pvVar3 + 8) = *(undefined4 *)((long)pvVar3 + 4);
              }
            }
          }
        }
      }
    }
    UVector::~UVector((UVector *)&endMarker);
  }
  return;
}

Assistant:

void     RBBITableBuilder::flagAcceptingStates() {
    if (U_FAILURE(*fStatus)) {
        return;
    }
    UVector     endMarkerNodes(*fStatus);
    RBBINode    *endMarker;
    int32_t     i;
    int32_t     n;

    if (U_FAILURE(*fStatus)) {
        return;
    }

    fTree->findNodes(&endMarkerNodes, RBBINode::endMark, *fStatus);
    if (U_FAILURE(*fStatus)) {
        return;
    }

    for (i=0; i<endMarkerNodes.size(); i++) {
        endMarker = (RBBINode *)endMarkerNodes.elementAt(i);
        for (n=0; n<fDStates->size(); n++) {
            RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(n);
            if (sd->fPositions->indexOf(endMarker) >= 0) {
                // Any non-zero value for fAccepting means this is an accepting node.
                // The value is what will be returned to the user as the break status.
                // If no other value was specified, force it to -1.

                if (sd->fAccepting==0) {
                    // State hasn't been marked as accepting yet.  Do it now.
                    sd->fAccepting = endMarker->fVal;
                    if (sd->fAccepting == 0) {
                        sd->fAccepting = -1;
                    }
                }
                if (sd->fAccepting==-1 && endMarker->fVal != 0) {
                    // Both lookahead and non-lookahead accepting for this state.
                    // Favor the look-ahead.  Expedient for line break.
                    // TODO:  need a more elegant resolution for conflicting rules.
                    sd->fAccepting = endMarker->fVal;
                }
                // implicit else:
                // if sd->fAccepting already had a value other than 0 or -1, leave it be.

                // If the end marker node is from a look-ahead rule, set
                //   the fLookAhead field for this state also.
                if (endMarker->fLookAheadEnd) {
                    // TODO:  don't change value if already set?
                    // TODO:  allow for more than one active look-ahead rule in engine.
                    //        Make value here an index to a side array in engine?
                    sd->fLookAhead = sd->fAccepting;
                }
            }
        }
    }
}